

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# criticalsection.cc
# Opt level: O2

bool __thiscall rtc::CriticalSection::TryEnter(CriticalSection *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  PlatformThreadRef PVar4;
  FatalMessage FStack_188;
  
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    if (this->recursion_count_ == 0) {
      if (this->thread_ != 0) {
        FatalMessage::FatalMessage
                  (&FStack_188,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/criticalsection.cc"
                   ,0x82);
        poVar3 = std::operator<<((ostream *)&FStack_188,"Check failed: !thread_");
        poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
        std::operator<<(poVar3,"# ");
        goto LAB_00144e79;
      }
      PVar4 = CurrentThreadRef();
      this->thread_ = PVar4;
    }
    else {
      bVar1 = CurrentThreadIsOwner(this);
      if (!bVar1) {
        FatalMessage::FatalMessage
                  (&FStack_188,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/criticalsection.cc"
                   ,0x85);
        poVar3 = std::operator<<((ostream *)&FStack_188,"Check failed: CurrentThreadIsOwner()");
        poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
        std::operator<<(poVar3,"# ");
LAB_00144e79:
        FatalMessage::~FatalMessage(&FStack_188);
      }
    }
    this->recursion_count_ = this->recursion_count_ + 1;
  }
  return iVar2 == 0;
}

Assistant:

EXCLUSIVE_TRYLOCK_FUNCTION(true) {
#if defined(WEBRTC_WIN)
  return TryEnterCriticalSection(&crit_) != FALSE;
#else
#if defined(WEBRTC_MAC) && !USE_NATIVE_MUTEX_ON_MAC
  if (!IsThreadRefEqual(owning_thread_, CurrentThreadRef())) {
    if (AtomicOps::CompareAndSwap(&lock_queue_, 0, 1) != 0)
      return false;
    owning_thread_ = CurrentThreadRef();
    RTC_DCHECK(!recursion_);
  } else {
    AtomicOps::Increment(&lock_queue_);
  }
  ++recursion_;
#else
  if (pthread_mutex_trylock(&mutex_) != 0)
    return false;
#endif
#if CS_DEBUG_CHECKS
  if (!recursion_count_) {
    RTC_DCHECK(!thread_);
    thread_ = CurrentThreadRef();
  } else {
    RTC_DCHECK(CurrentThreadIsOwner());
  }
  ++recursion_count_;
#endif
  return true;
#endif
}